

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.cpp
# Opt level: O2

int64_t getLastPCR(File *file,int bufferSize,int64_t fileSize)

{
  uint8_t *buffer;
  ulong uVar1;
  PESPacket *this;
  int64_t iVar2;
  size_t in_RCX;
  long offset;
  
  offset = fileSize - bufferSize;
  if (offset < 1) {
    offset = 0;
  }
  File::seek(file,offset,smBegin);
  buffer = (uint8_t *)operator_new__((long)bufferSize);
  uVar1 = File::read(file,(int)buffer,(void *)(ulong)(uint)bufferSize,in_RCX);
  if ((int)uVar1 < 1) {
    iVar2 = -2;
  }
  else {
    this = (PESPacket *)MPEGHeader::findNextMarker(buffer,buffer + (uVar1 & 0xffffffff));
    iVar2 = -1;
    for (; this <= (PESPacket *)(buffer + ((uVar1 & 0xffffffff) - 0x11));
        this = (PESPacket *)
               MPEGHeader::findNextMarker(&this->m_pesPacketLenHi,buffer + (uVar1 & 0xffffffff))) {
      if (((byte)(this->m_streamID + 0x41) < 0x31 || (this->m_streamID & 0xbf) == 0xbd) &&
         ((char)this->flagsLo < '\0')) {
        iVar2 = PESPacket::getPts(this);
      }
    }
    operator_delete__(buffer);
  }
  return iVar2;
}

Assistant:

int64_t getLastPCR(const File& file, const int bufferSize, const int64_t fileSize)
{
    file.seek(FFMAX(0, fileSize - bufferSize), File::SeekMethod::smBegin);
    const auto tmpBuffer = new uint8_t[bufferSize];
    const int len = file.read(tmpBuffer, bufferSize);
    if (len < 1)
        return -2;
    uint8_t* curPtr = tmpBuffer;
    uint8_t* bufEnd = tmpBuffer + len;
    int64_t lastPcrVal = -1;

    curPtr = MPEGHeader::findNextMarker(curPtr, bufEnd);
    while (curPtr <= bufEnd - 9 - 8)
    {
        const auto pesPacket = reinterpret_cast<PESPacket*>(curPtr);
        const uint8_t startcode = curPtr[3];
        if ((startcode >= 0xc0 && startcode <= 0xef) || (startcode == PES_PRIVATE_DATA1) || (startcode == PES_VC1_ID) ||
            (startcode == PES_PRIVATE_DATA2))
        {
            if ((pesPacket->flagsLo & 0x80) == 0x80)
                lastPcrVal = pesPacket->getPts();
        }
        curPtr = MPEGHeader::findNextMarker(curPtr + 4, bufEnd);
    }
    delete[] tmpBuffer;
    return lastPcrVal;
}